

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_utils.h
# Opt level: O0

float xray_re::calc_signed_area<float>(_vector3<float> *p0,_vector3<float> *p1,_vector3<float> *p2)

{
  _vector3<float> *this;
  _vector3<float> *v;
  float fVar1;
  _vector3<float> local_44;
  _vector3<float> local_38;
  float local_2c;
  float local_28;
  float z;
  float y;
  float x;
  _vector3<float> *p2_local;
  _vector3<float> *p1_local;
  _vector3<float> *p0_local;
  
  z = (p2->field_0).field_0.y * (p0->field_0).field_0.z +
      -((p2->field_0).field_0.z * (p0->field_0).field_0.y) +
      (p1->field_0).field_0.y * (p2->field_0).field_0.z +
      -((p1->field_0).field_0.z * (p2->field_0).field_0.y) +
      (p0->field_0).field_0.y * (p1->field_0).field_0.z +
      -((p0->field_0).field_0.z * (p1->field_0).field_0.y);
  local_28 = (p2->field_0).field_0.z * (p0->field_0).field_0.x +
             -((p2->field_0).field_0.x * (p0->field_0).field_0.z) +
             (p1->field_0).field_0.z * (p2->field_0).field_0.x +
             -((p1->field_0).field_0.x * (p2->field_0).field_0.z) +
             (p0->field_0).field_0.z * (p1->field_0).field_0.x +
             -((p0->field_0).field_0.x * (p1->field_0).field_0.z);
  local_2c = (p2->field_0).field_0.x * (p0->field_0).field_0.y +
             -((p2->field_0).field_0.y * (p0->field_0).field_0.x) +
             (p1->field_0).field_0.x * (p2->field_0).field_0.y +
             -((p1->field_0).field_0.y * (p2->field_0).field_0.x) +
             (p0->field_0).field_0.x * (p1->field_0).field_0.y +
             -((p0->field_0).field_0.y * (p1->field_0).field_0.x);
  _y = p2;
  p2_local = p1;
  p1_local = p0;
  memset(&local_38,0,0xc);
  this = _vector3<float>::calc_normal(&local_38,p1_local,p2_local,_y);
  memset(&local_44,0,0xc);
  v = _vector3<float>::set(&local_44,z,local_28,local_2c);
  fVar1 = _vector3<float>::dot_product(this,v);
  return fVar1 * 0.5;
}

Assistant:

static inline T calc_signed_area(const _vector3<T>& p0, const _vector3<T>& p1, const _vector3<T>& p2)
{
	// i = 0, j = 1
	T x = p0.y*p1.z - p0.z*p1.y;
	T y = p0.z*p1.x - p0.x*p1.z;
	T z = p0.x*p1.y - p0.y*p1.x;

	// i = 1, j = 2
	x += p1.y*p2.z - p1.z*p2.y;
	y += p1.z*p2.x - p1.x*p2.z;
	z += p1.x*p2.y - p1.y*p2.x;

	// i = 2, j = 0
	x += p2.y*p0.z - p2.z*p0.y;
	y += p2.z*p0.x - p2.x*p0.z;
	z += p2.x*p0.y - p2.y*p0.x;

	return T(0.5)*_vector3<T>().calc_normal(p0, p1, p2).dot_product(_vector3<T>().set(x, y, z));
}